

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Object::~Object(Object *this)

{
  Object *this_local;
  
  ~Object(this);
  operator_delete(this);
  return;
}

Assistant:

Object::~Object() {
  if (finalizer_) {
    finalizer_(this);
  }
}